

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_hom.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_hom(level_tools *this)

{
  xr_mesh_builder *this_00;
  xr_object *this_01;
  hom_surface_factory surface_factory;
  xr_surface_factory local_20;
  
  if (this->m_level->m_hom != (xr_level_hom *)0x0) {
    xray_re::msg("building %s","HOM object");
    this_00 = (xr_mesh_builder *)operator_new(600);
    level_aux_mesh::level_aux_mesh((level_aux_mesh *)this_00);
    level_aux_mesh::build((level_aux_mesh *)this_00,this->m_level->m_hom);
    xray_re::xr_level::clear_hom(this->m_level);
    local_20._vptr_xr_surface_factory = (_func_int **)&PTR__xr_surface_factory_00235318;
    this_01 = (xr_object *)operator_new(400);
    xray_re::xr_object::xr_object(this_01,&local_20);
    xray_re::xr_mesh_builder::commit(this_00,this_01);
    std::__cxx11::string::assign((char *)&(this_00->super_xr_mesh).m_name);
    (*(this_01->super_xr_surface_factory)._vptr_xr_surface_factory[6])(this_01);
    this_01->m_flags = 8;
    save_scene_object(this,this_01,"occ");
    (*(this_01->super_xr_surface_factory)._vptr_xr_surface_factory[1])(this_01);
  }
  return;
}

Assistant:

void level_tools::reconstruct_hom()
{
	if (m_level->hom() == 0)
		return;
	msg("building %s", "HOM object");

	level_aux_mesh* mesh = new level_aux_mesh;
	mesh->build(*m_level->hom());
	m_level->clear_hom();

	hom_surface_factory surface_factory;
	xr_object* object = new xr_object(&surface_factory);
	mesh->commit(*object);
	mesh->name() = "occShape";
	object->denominate_surfaces();
	object->flags() = EOF_HOM;
	save_scene_object(object, "occ");
	delete object;
}